

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall Am_Value_List::~Am_Value_List(Am_Value_List *this)

{
  Am_Value_List_Data *this_00;
  
  this_00 = this->data;
  if (this_00 != (Am_Value_List_Data *)0x0) {
    if ((this_00->super_Am_Wrapper).refs == 0) {
      Am_Error();
    }
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  this->data = (Am_Value_List_Data *)0x0;
  this->item = (Am_List_Item *)0x0;
  return;
}

Assistant:

Am_Value_List::~Am_Value_List()
{
  if (data) {
    if (data->Is_Zero())
      Am_Error();
    data->Release();
  }
  data = nullptr;
  item = nullptr;
}